

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined7 uVar6;
  uint uVar7;
  uint32_t uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  allocator local_7d;
  uint local_7c;
  string local_78;
  longlong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar12 = 100000;
  local_58 = 1;
  local_48 = 0;
  local_40 = 0;
  uVar11 = 0;
  do {
    while( true ) {
      while( true ) {
        iVar5 = getopt(argc,argv,"vhtm:n:i:");
        if (iVar5 != 0x6e) break;
        uVar12 = atoll(_optarg);
      }
      if (iVar5 < 0x6d) break;
      if (iVar5 == 0x6d) {
        local_58 = atoll(_optarg);
      }
      else {
        uVar6 = (undefined7)(CONCAT44(extraout_var,iVar5) >> 8);
        if (iVar5 == 0x74) {
          local_48 = CONCAT71(uVar6,1);
        }
        else {
          if (iVar5 != 0x76) goto LAB_0011c56a;
          local_40 = CONCAT71(uVar6,1);
        }
      }
    }
    if (iVar5 == -1) {
      if (uVar12 >> 0x20 != 0) {
        printf("setting n to %u \n",0xffffffff);
        uVar12 = 0xffffffff;
      }
      if (uVar11 >> 0x20 != 0) {
        printf("setting iterations to %u \n",0xffffffff);
        uVar11 = 0xffffffff;
      }
      uVar1 = local_48;
      local_50 = 10;
      if (uVar12 * local_58 < 1000000) {
        local_50 = 100;
      }
      if (uVar11 != 0) {
        local_50 = uVar11;
      }
      if (uVar12 != 0) {
        bVar2 = (byte)local_48;
        if ((local_48 & 1) != 0) {
          puts("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs")
          ;
        }
        bVar2 = (byte)local_40 ^ 1 | bVar2;
        if ((bVar2 & 1) == 0) {
          printf("%-40s\t","memcpy-8");
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"memcpy-8","");
        uVar7 = (byte)local_40 & 1;
        uVar10 = (uint)uVar1 & 1;
        uVar8 = (uint32_t)uVar12;
        bVar4 = SUB41(uVar10,0);
        benchmarkMemoryCopy(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,SUB41(uVar7,0),
                            bVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((bVar2 & 1) == 0) {
          printf("%-40s\t","memcpy-16");
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"memcpy-16","");
        benchmarkMemoryCopy(&local_78,uVar8 * 2,(uint32_t)local_58,(uint32_t)local_50,SUB41(uVar7,0)
                            ,bVar4);
        local_7c = uVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar13));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u16_method_names + lVar13);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar3 = benchmarkMany(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                *(pospopcnt_u16_method_type *)((long)pospopcnt_u16_methods + lVar13)
                                ,SUB41(local_7c,0),true,bVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar3) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x38);
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar13 + 0x38));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u16_method_names + lVar13 + 0x38);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar3 = benchmarkMany(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                *(pospopcnt_u16_method_type *)
                                 ((long)pospopcnt_u16_sse_methods + lVar13),SUB41(local_7c,0),true,
                                bVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar3) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          uVar7 = local_7c;
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x38);
        lVar13 = 0;
        local_48 = uVar12;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar13 + 0x70));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u16_method_names + lVar13 + 0x70);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar3 = benchmarkMany(&local_78,(uint32_t)local_48,(uint32_t)local_58,(uint32_t)local_50,
                                *(pospopcnt_u16_method_type *)
                                 ((long)pospopcnt_u16_avx2_methods + lVar13),SUB41(uVar7,0),true,
                                bVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar3) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          uVar12 = local_48;
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x60);
        lVar13 = 0;
        local_38 = (ulong)uVar10;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar13 + 0xd0));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u16_method_names + lVar13 + 0xd0);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          uVar8 = (uint32_t)uVar12;
          bVar4 = benchmarkMany(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                *(pospopcnt_u16_method_type *)
                                 ((long)pospopcnt_u16_avx512_methods + lVar13),SUB41(uVar7,0),true,
                                SUB81(local_38,0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar4) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          uVar11 = local_38;
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x60);
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar13 + 8));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u8_method_names + lVar13 + 8);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar3 = SUB81(uVar11,0);
          bVar4 = benchmarkMany8(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                 *(pospopcnt_u8_method_type *)((long)pospopcnt_u8_methods + lVar13),
                                 SUB41(local_7c,0),true,bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar4) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x30);
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar13 + 0x38));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u8_method_names + lVar13 + 0x38);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar4 = benchmarkMany8(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                 *(pospopcnt_u8_method_type *)
                                  ((long)pospopcnt_u8_sse_methods + lVar13),SUB41(local_7c,0),true,
                                 bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar4) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x40);
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar13 + 0x78));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u8_method_names + lVar13 + 0x78);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar4 = benchmarkMany8(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                 *(pospopcnt_u8_method_type *)
                                  ((long)pospopcnt_u8_avx2_methods + lVar13),SUB41(local_7c,0),true,
                                 bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar4) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x68);
        lVar13 = 0;
        do {
          if ((bVar2 & 1) == 0) {
            printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar13 + 0xe0));
          }
          fflush((FILE *)0x0);
          pcVar9 = *(char **)((long)pospopcnt_u8_method_names + lVar13 + 0xe0);
          std::__cxx11::string::string((string *)&local_78,pcVar9,&local_7d);
          bVar4 = benchmarkMany8(&local_78,uVar8,(uint32_t)local_58,(uint32_t)local_50,
                                 *(pospopcnt_u8_method_type *)
                                  ((long)pospopcnt_u8_avx512_methods + lVar13),SUB41(local_7c,0),
                                 true,bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (!bVar4) {
            printf("Problem detected with %s.\n",pcVar9);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x68);
        iVar5 = 0;
        if ((local_40 & 1) == 0) {
          pcVar9 = "Try -v to get more details.";
          iVar5 = 0;
LAB_0011c554:
          puts(pcVar9);
        }
        return iVar5;
      }
      iVar5 = 1;
      pcVar9 = "n cannot be zero.";
      goto LAB_0011c554;
    }
    if (iVar5 == 0x68) {
      printf(" Try %s -n 100000 -i 15 -v \n",*argv);
      puts("-n is the number of 16-bit words ");
      puts("-i is the number of tests or iterations ");
      pcVar9 = "-v makes things verbose";
      iVar5 = 0;
      goto LAB_0011c554;
    }
    if (iVar5 != 0x69) {
LAB_0011c56a:
      abort();
    }
    iVar5 = atoi(_optarg);
    uVar11 = (ulong)iVar5;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    bool tabular = false;
    int c;

    while ((c = getopt(argc, argv, "vhtm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 't':
            tabular = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    // printf("n = %zu m = %zu \n", n, m);
    // printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    // if(array_in_bytes < 1024) {
    //   printf("array size: %zu B\n", array_in_bytes);
    // } else if (array_in_bytes < 1024 * 1024) {
    //   printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    // } else {
    //   printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    // }

// #if POSPOPCNT_SIMD_VERSION >= 5
//     measurepopcnt(n*m, iterations, verbose);
// #endif
//     measureoverhead(n*m, iterations, verbose);
    
    if (tabular)
        printf("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs\n");

    if (verbose && !tabular) printf("%-40s\t", "memcpy-8");
    benchmarkMemoryCopy("memcpy-8", n, m, iterations, verbose, tabular);
    if (verbose && !tabular) printf("%-40s\t", "memcpy-16");
    benchmarkMemoryCopy("memcpy-16", 2*n, m, iterations, verbose, tabular);

    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[k], n, m, iterations, pospopcnt_u16_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        // if (verbose) printf("\n");
    }
#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[7+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[7+k], n, m, iterations, pospopcnt_u16_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[7+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[14+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[14+k], n, m, iterations, pospopcnt_u16_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[14+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[26+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[26+k], n, m, iterations, pospopcnt_u16_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[26+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

    for (size_t k = 0; k < 6; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1], n, m, iterations, pospopcnt_u8_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1]);
        }
        // if (verbose) printf("\n");
    }

#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 8; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6], n, m, iterations, pospopcnt_u8_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8], n, m, iterations, pospopcnt_u8_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8+13]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8+13], n, m, iterations, pospopcnt_u8_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8+13]);
        }
        // if (verbose) printf("\n");
    }
#endif

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}